

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::AggregateMarking::GetAggregateMarkingString_abi_cxx11_
          (KString *__return_storage_ptr__,AggregateMarking *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,this->m_sAggregateMarkingString,&local_9);
  return __return_storage_ptr__;
}

Assistant:

KString AggregateMarking::GetAggregateMarkingString() const
{
    return m_sAggregateMarkingString;
}